

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O0

ostream * amrex::operator<<(ostream *os,DistributionMapping *pmap)

{
  ostream *poVar1;
  long lVar2;
  Long LVar3;
  int *piVar4;
  ulong uVar5;
  ostream *in_RDI;
  int i;
  size_type in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar6;
  
  poVar1 = std::operator<<(in_RDI,"(DistributionMapping");
  std::operator<<(poVar1,'\n');
  iVar6 = 0;
  while( true ) {
    lVar2 = (long)iVar6;
    DistributionMapping::ProcessorMap((DistributionMapping *)0x11fb048);
    LVar3 = Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0x11fb050);
    if (LVar3 <= lVar2) break;
    poVar1 = std::operator<<(in_RDI,"m_pmap[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar6);
    poVar1 = std::operator<<(poVar1,"] = ");
    DistributionMapping::ProcessorMap((DistributionMapping *)0x11fb098);
    piVar4 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)poVar1,in_stack_ffffffffffffffc8);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*piVar4);
    std::operator<<(poVar1,'\n');
    iVar6 = iVar6 + 1;
  }
  poVar1 = std::operator<<(in_RDI,')');
  std::operator<<(poVar1,'\n');
  uVar5 = std::ios::fail();
  if ((uVar5 & 1) != 0) {
    Error_host((char *)CONCAT44(iVar6,in_stack_ffffffffffffffe0));
  }
  return in_RDI;
}

Assistant:

std::ostream&
operator<< (std::ostream&              os,
            const DistributionMapping& pmap)
{
    os << "(DistributionMapping" << '\n';

    for (int i = 0; i < pmap.ProcessorMap().size(); ++i)
    {
        os << "m_pmap[" << i << "] = " << pmap.ProcessorMap()[i] << '\n';
    }

    os << ')' << '\n';

    if (os.fail())
        amrex::Error("operator<<(ostream &, DistributionMapping &) failed");

    return os;
}